

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
::dealloc(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *this)

{
  size_t sVar1;
  void *p;
  
  sVar1 = capacity(this);
  if (sVar1 != 0) {
    slot_array(this);
    capacity(this);
    infoz(this);
    p = CommonFields::backing_array_start((CommonFields *)this);
    sVar1 = CommonFields::alloc_size((CommonFields *)this,0x10,8);
    Deallocate<8ul,std::allocator<std::pair<int_const,double>>>
              ((allocator<std::pair<const_int,_double>_> *)this,p,sVar1);
    return;
  }
  __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe4f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, double>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, double>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<int, double>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, double>>]"
               );
}

Assistant:

inline void dealloc() {
    ABSL_SWISSTABLE_ASSERT(capacity() != 0);
    // Unpoison before returning the memory to the allocator.
    SanitizerUnpoisonMemoryRegion(slot_array(), sizeof(slot_type) * capacity());
    infoz().Unregister();
    Deallocate<BackingArrayAlignment(alignof(slot_type))>(
        &alloc_ref(), common().backing_array_start(),
        common().alloc_size(sizeof(slot_type), alignof(slot_type)));
  }